

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qprintdialog.cpp
# Opt level: O0

int __thiscall QPrintDialog::qt_metacall(QPrintDialog *this,Call _c,int _id,void **_a)

{
  long lVar1;
  undefined8 *in_RCX;
  int in_ESI;
  void **in_RDI;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffffb8;
  Call in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_28;
  int in_stack_ffffffffffffffe8;
  Call in_stack_ffffffffffffffec;
  QMetaType in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = QAbstractPrintDialog::qt_metacall
                       ((QAbstractPrintDialog *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,(void **)0x1719a4);
  if (-1 < local_28) {
    if (in_ESI == 0) {
      if (local_28 < 4) {
        qt_static_metacall((QObject *)in_stack_fffffffffffffff0.d_ptr,in_stack_ffffffffffffffec,
                           in_stack_ffffffffffffffe8,in_RDI);
      }
      local_28 = local_28 + -4;
    }
    if (in_ESI == 7) {
      if (local_28 < 4) {
        memset(&stack0xfffffffffffffff0,0,8);
        QMetaType::QMetaType((QMetaType *)&stack0xfffffffffffffff0);
        *(QMetaTypeInterface **)*in_RCX = in_stack_fffffffffffffff0.d_ptr;
      }
      local_28 = local_28 + -4;
    }
    if ((((in_ESI == 1) || (in_ESI == 2)) || (in_ESI == 3)) || ((in_ESI == 8 || (in_ESI == 6)))) {
      qt_static_metacall((QObject *)in_stack_fffffffffffffff0.d_ptr,in_stack_ffffffffffffffec,
                         in_stack_ffffffffffffffe8,in_RDI);
      local_28 = local_28 + -1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

int QPrintDialog::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QAbstractPrintDialog::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 4)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 4;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 4)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 4;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    }
    return _id;
}